

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::DecommitPages
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,char *address,size_t pageCount)

{
  undefined4 *puVar1;
  PageMemoryData *pPVar2;
  code *pcVar3;
  bool bVar4;
  size_t dwSize;
  size_t *psVar5;
  undefined8 *in_FS_OFFSET;
  undefined1 auVar6 [16];
  
  if (pageCount >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa2b,"(pageCount <= ((uint32_t)~((uint32_t)0)))","pageCount <= MAXUINT32");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::GetVirtualAllocator
            (&this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            );
  dwSize = pageCount * 0x1000;
  VirtualAllocWrapper::Free
            ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,address,dwSize,0x4000);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SubUsedBytes(&this->
                  super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 ,dwSize);
  pPVar2 = (this->
           super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ).memoryData;
  if (pPVar2 == (PageMemoryData *)0x0) {
    psVar5 = &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).committedBytes;
  }
  else {
    psVar5 = &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).committedBytes;
    *psVar5 = *psVar5 + pageCount * -0x1000;
    auVar6._8_4_ = (int)pageCount;
    auVar6._0_8_ = pageCount;
    auVar6._12_4_ = (int)(pageCount >> 0x20);
    pPVar2->releasePageCount = pageCount + pPVar2->releasePageCount;
    pPVar2->decommitPageCount = auVar6._8_8_ + pPVar2->decommitPageCount;
    psVar5 = &pPVar2->currentCommittedPageCount;
    dwSize = pageCount;
  }
  *psVar5 = *psVar5 - dwSize;
  return;
}

Assistant:

void
HeapPageAllocator<T>::DecommitPages(__in char* address, size_t pageCount /* = 1 */)
{
    Assert(pageCount <= MAXUINT32);
#pragma prefast(suppress:__WARNING_WIN32UNRELEASEDVADS, "The remainder of the clean-up is done later.");
    this->GetVirtualAllocator()->Free(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    this->LogFreePages(pageCount);
    this->LogDecommitPages(pageCount);
}